

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::BadStatusOrAccess::BadStatusOrAccess
          (BadStatusOrAccess *this,BadStatusOrAccess *other)

{
  *(undefined ***)this = &PTR__BadStatusOrAccess_00830398;
  (this->status_).rep_ = (other->status_).rep_;
  (other->status_).rep_ = 0x37;
  (this->init_what_).control_.super___atomic_base<unsigned_int>._M_i = 0;
  (this->what_)._M_dataplus._M_p = (pointer)&(this->what_).field_2;
  (this->what_)._M_string_length = 0;
  (this->what_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

BadStatusOrAccess::BadStatusOrAccess(BadStatusOrAccess&& other)
    : status_(std::move(other.status_)) {}